

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

void __thiscall
kj::BufferedOutputStreamWrapper::BufferedOutputStreamWrapper
          (BufferedOutputStreamWrapper *this,OutputStream *inner,ArrayPtr<unsigned_char> buffer)

{
  bool bVar1;
  uchar *puVar2;
  ArrayPtr<unsigned_char> AVar3;
  OutputStream *inner_local;
  BufferedOutputStreamWrapper *this_local;
  ArrayPtr<unsigned_char> buffer_local;
  
  buffer_local.ptr = (uchar *)buffer.size_;
  this_local = (BufferedOutputStreamWrapper *)buffer.ptr;
  BufferedOutputStream::BufferedOutputStream(&this->super_BufferedOutputStream);
  (this->super_BufferedOutputStream).super_OutputStream._vptr_OutputStream =
       (_func_int **)&PTR__BufferedOutputStreamWrapper_00433208;
  this->inner = inner;
  bVar1 = ArrayPtr<unsigned_char>::operator==((ArrayPtr<unsigned_char> *)&this_local,(void *)0x0);
  if (bVar1) {
    heapArray<unsigned_char>(&this->ownedBuffer,0x2000);
  }
  else {
    Array<unsigned_char>::Array(&this->ownedBuffer,(void *)0x0);
  }
  bVar1 = ArrayPtr<unsigned_char>::operator==((ArrayPtr<unsigned_char> *)&this_local,(void *)0x0);
  if (bVar1) {
    AVar3 = kj::Array::operator_cast_to_ArrayPtr((Array *)&this->ownedBuffer);
    this->buffer = AVar3;
  }
  else {
    (this->buffer).ptr = (uchar *)this_local;
    (this->buffer).size_ = (size_t)buffer_local.ptr;
  }
  puVar2 = ArrayPtr<unsigned_char>::begin(&this->buffer);
  this->bufferPos = puVar2;
  UnwindDetector::UnwindDetector(&this->unwindDetector);
  return;
}

Assistant:

BufferedOutputStreamWrapper::BufferedOutputStreamWrapper(OutputStream& inner, ArrayPtr<byte> buffer)
    : inner(inner),
      ownedBuffer(buffer == nullptr ? heapArray<byte>(8192) : nullptr),
      buffer(buffer == nullptr ? ownedBuffer : buffer),
      bufferPos(this->buffer.begin()) {}